

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O1

void disruptor::test::BusySpinStrategy::WaitForDependents_invoker(void)

{
  undefined8 uVar1;
  WaitForDependents t;
  string local_490;
  undefined7 uStack_48f;
  undefined1 local_480 [16];
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  string local_420;
  undefined7 uStack_41f;
  undefined1 local_410 [96];
  ios_base local_3b0 [264];
  undefined1 *local_2a8;
  long local_2a0;
  undefined1 local_298 [16];
  undefined1 *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  undefined1 local_238 [176];
  atomic<long> local_188;
  atomic<long> local_110;
  undefined1 *local_c0;
  long local_b8;
  undefined1 local_b0 [24];
  atomic<long> local_98;
  pointer local_58;
  pointer ppSStack_50;
  pointer local_48;
  undefined **local_40;
  atomic<bool> local_38;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_428 = "";
  memset((ostringstream *)local_238,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
  local_b8 = 0;
  local_b0[0] = 0;
  local_420 = (string)0x22;
  local_c0 = local_b0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,(char *)&local_420,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"WaitForDependents",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_c0,&local_420);
  if ((undefined1 *)CONCAT71(uStack_41f,local_420) != local_410) {
    operator_delete((undefined1 *)CONCAT71(uStack_41f,local_420));
  }
  local_248 = local_c0;
  local_240 = local_c0 + local_b8;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_430,0x61);
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  std::ios_base::~ios_base((ios_base *)(local_238 + 0x70));
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_238._56_8_ = -1;
  local_188.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  local_110.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  local_98.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  local_58 = (pointer)0x0;
  ppSStack_50 = (pointer)0x0;
  local_48 = (pointer)0x0;
  local_40 = &PTR_SignalAllWhenBlocking_0011c558;
  local_38._M_base._M_i = (__atomic_base<bool>)false;
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_438 = "";
  memset((ostringstream *)&local_420,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_420);
  local_2a0 = 0;
  local_298[0] = 0;
  local_490 = (string)0x22;
  local_2a8 = local_298;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_420,(char *)&local_490,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_420,"WaitForDependents",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_420,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2a8,&local_490);
  if ((undefined1 *)CONCAT71(uStack_48f,local_490) != local_480) {
    operator_delete((undefined1 *)CONCAT71(uStack_48f,local_490));
  }
  local_258 = local_2a8;
  local_250 = local_2a8 + local_2a0;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_440,0x61);
  if (local_2a8 != local_298) {
    operator_delete(local_2a8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_420);
  std::ios_base::~ios_base(local_3b0);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_448 = "";
  memset((ostringstream *)&local_420,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_420);
  local_2a0 = 0;
  local_298[0] = 0;
  local_490 = (string)0x22;
  local_2a8 = local_298;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_420,(char *)&local_490,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_420,"WaitForDependents",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_420,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2a8,&local_490);
  if ((undefined1 *)CONCAT71(uStack_48f,local_490) != local_480) {
    operator_delete((undefined1 *)CONCAT71(uStack_48f,local_490));
  }
  local_268 = local_2a8;
  local_260 = local_2a8 + local_2a0;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_450,0x61);
  if (local_2a8 != local_298) {
    operator_delete(local_2a8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_420);
  std::ios_base::~ios_base(local_3b0);
  WaitForDependents::test_method((WaitForDependents *)local_238);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_460 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_458 = "";
  memset((ostringstream *)&local_420,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_420);
  local_2a0 = 0;
  local_298[0] = 0;
  local_490 = (string)0x22;
  local_2a8 = local_298;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_420,(char *)&local_490,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_420,"WaitForDependents",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_420,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2a8,&local_490);
  if ((undefined1 *)CONCAT71(uStack_48f,local_490) != local_480) {
    operator_delete((undefined1 *)CONCAT71(uStack_48f,local_490));
  }
  local_278 = local_2a8;
  local_270 = local_2a8 + local_2a0;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_460,0x61);
  if (local_2a8 != local_298) {
    operator_delete(local_2a8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_420);
  std::ios_base::~ios_base(local_3b0);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_468 = "";
  memset((ostringstream *)&local_420,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_420);
  local_2a0 = 0;
  local_298[0] = 0;
  local_490 = (string)0x22;
  local_2a8 = local_298;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_420,(char *)&local_490,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_420,"WaitForDependents",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_420,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2a8,&local_490);
  if ((undefined1 *)CONCAT71(uStack_48f,local_490) != local_480) {
    operator_delete((undefined1 *)CONCAT71(uStack_48f,local_490));
  }
  local_288 = local_2a8;
  local_280 = local_2a8 + local_2a0;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_470,0x61);
  if (local_2a8 != local_298) {
    operator_delete(local_2a8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_420);
  std::ios_base::~ios_base(local_3b0);
  if (local_58 != (pointer)0x0) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(WaitForDependents) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor,
                                        allDependents(), alerted));
  });

  cursor.IncrementAndGet(1L);
  strategy.SignalAllWhenBlocking();
  // dependents haven't moved, WaitFor() should still block.
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_1.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_2.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_3.IncrementAndGet(1L);
  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);
}